

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

sexp sexp_get_output_string_op(sexp ctx,sexp self,sexp_sint_t n,sexp out)

{
  sexp_uint_t slen;
  sexp psVar1;
  sexp psVar2;
  sexp_sint_t n_00;
  sexp_sint_t extraout_RDX;
  char *msg;
  sexp_sint_t n_01;
  sexp extraout_RDX_00;
  sexp extraout_RDX_01;
  sexp extraout_RDX_02;
  sexp local_68;
  sexp ls;
  sexp local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_40.var = &local_68;
  ls = (sexp)&DAT_0000043e;
  local_58 = (sexp)0x43e;
  local_68 = (sexp)&DAT_0000043e;
  if ((((ulong)out & 3) != 0) || (out->tag != 0x11)) {
    psVar1 = sexp_type_exception(ctx,self,0x11,out);
    return psVar1;
  }
  if ((out->value).flonum_bits[0x28] == '\0') {
    msg = "output port is closed";
  }
  else {
    psVar1 = (out->value).type.cpl;
    if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 6)) {
      local_50.var = &ls;
      local_30.next = &local_50;
      local_50.next = (ctx->value).context.saves;
      local_30.var = &local_58;
      local_40.next = &local_30;
      (ctx->value).context.saves = &local_40;
      slen = (out->value).port.offset;
      if (slen == 0) {
        local_58 = (((out->value).type.cpl)->value).type.cpl;
        n_01 = 0;
        psVar1 = self;
        local_40.var = &local_68;
      }
      else {
        psVar1 = (out->value).type.setters;
        local_68 = sexp_c_string(ctx,(char *)psVar1,slen);
        local_58 = sexp_cons_op(ctx,psVar1,n_00,local_68,(((out->value).type.cpl)->value).type.cpl);
        n_01 = extraout_RDX;
      }
      local_68 = sexp_reverse_op(ctx,psVar1,n_01,local_58);
      psVar2 = (sexp)&DAT_0000003e;
      psVar1 = extraout_RDX_00;
      ls = local_68;
      for (; (((ulong)local_68 & 3) == 0 && (local_68->tag == 6));
          local_68 = (local_68->value).type.cpl) {
        psVar1 = (local_68->value).type.name;
        if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 9)) {
          psVar2 = sexp_xtype_exception(ctx,self,"not an output string port",out);
          psVar1 = extraout_RDX_01;
        }
      }
      if (local_68 != (sexp)&DAT_0000023e) {
        psVar2 = sexp_xtype_exception(ctx,self,"not an output string port",out);
        psVar1 = extraout_RDX_02;
      }
      if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
        psVar2 = sexp_string_concatenate_op
                           (ctx,(sexp)0x0,(sexp_sint_t)psVar1,ls,(sexp)&DAT_0000003e);
      }
      (ctx->value).context.saves = local_50.next;
      return psVar2;
    }
    msg = "not a string output port";
  }
  psVar1 = sexp_xtype_exception(ctx,self,msg,out);
  return psVar1;
}

Assistant:

sexp sexp_get_output_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp out) {
  sexp res;
  sexp_gc_var3(ls, rev, tmp);
  sexp_assert_type(ctx, sexp_oportp, SEXP_OPORT, out);
  if (!sexp_port_openp(out))
    return sexp_xtype_exception(ctx, self, "output port is closed", out);
  if (!sexp_pairp(sexp_port_cookie(out)))
    return sexp_xtype_exception(ctx, self, "not a string output port", out);
  sexp_gc_preserve3(ctx, ls, rev, tmp);
  if (sexp_port_offset(out) > 0) {
    tmp = sexp_c_string(ctx, sexp_port_buf(out), sexp_port_offset(out));
    rev = sexp_cons(ctx, tmp, sexp_cdr(sexp_port_cookie(out)));
  } else {
    rev = sexp_cdr(sexp_port_cookie(out));
  }
  ls = sexp_reverse(ctx, rev);
  res = SEXP_FALSE;
  for (tmp = ls; sexp_pairp(tmp); tmp = sexp_cdr(tmp))
    if (!sexp_stringp(sexp_car(tmp)))
      res = sexp_xtype_exception(ctx, self, "not an output string port", out);
  if (!sexp_nullp(tmp))
    res = sexp_xtype_exception(ctx, self, "not an output string port", out);
  if (!sexp_exceptionp(res))
    res = sexp_string_concatenate(ctx, ls, SEXP_FALSE);
  sexp_gc_release3(ctx);
  return res;
}